

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,int index)

{
  undefined1 *puVar1;
  shared_handle sharedEpt;
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_28,&this->mLocalEndpoints);
  puVar1 = invalidEpt;
  if ((-1 < index) && (index < (int)((local_28.data)->dataStorage).csize)) {
    puVar1 = (undefined1 *)
             (((local_28.data)->dataStorage).dataptr[(uint)index >> 5] + (index & 0x1f));
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28.m_handle_lock);
  return (Endpoint *)puVar1;
}

Assistant:

const Endpoint& MessageFederateManager::getEndpoint(int index) const
{
    auto sharedEpt = mLocalEndpoints.lock_shared();
    if (isValidIndex(index, *sharedEpt)) {
        return (*sharedEpt)[index];
    }
    return invalidEpt;
}